

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O0

AmpIO * SelectBoard(string *portName,vector<AmpIO_*,_std::allocator<AmpIO_*>_> *boardList,
                   AmpIO *curBoard)

{
  byte bVar1;
  int iVar2;
  size_type sVar3;
  ostream *poVar4;
  void *pvVar5;
  reference ppAVar6;
  uint local_34;
  ulong uStack_30;
  int num;
  size_t i;
  AmpIO *newBoard;
  AmpIO *curBoard_local;
  vector<AmpIO_*,_std::allocator<AmpIO_*>_> *boardList_local;
  string *portName_local;
  
  sVar3 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::size(boardList);
  if (1 < sVar3) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Select ");
    poVar4 = std::operator<<(poVar4,(string *)portName);
    std::operator<<(poVar4," Board: ");
    for (uStack_30 = 0; sVar3 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::size(boardList),
        uStack_30 < sVar3; uStack_30 = uStack_30 + 1) {
      pvVar5 = (void *)std::ostream::operator<<(&std::cout,std::hex);
      ppAVar6 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[](boardList,uStack_30);
      bVar1 = BoardIO::GetBoardId((BoardIO *)*ppAVar6);
      poVar4 = (ostream *)std::ostream::operator<<(pvVar5,(uint)bVar1);
      std::operator<<(poVar4," ");
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"(any other key to keep current board ");
    pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
    bVar1 = BoardIO::GetBoardId((BoardIO *)curBoard);
    pvVar5 = (void *)std::ostream::operator<<(pvVar5,(uint)bVar1);
    poVar4 = (ostream *)std::ostream::operator<<(pvVar5,std::dec);
    poVar4 = std::operator<<(poVar4,")");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    iVar2 = getchar();
    if ((iVar2 < 0x30) || (0x39 < iVar2)) {
      if ((iVar2 < 0x61) || (0x66 < iVar2)) {
        if ((iVar2 < 0x41) || (0x46 < iVar2)) {
          local_34 = 0xffffffff;
        }
        else {
          local_34 = iVar2 - 0x37;
        }
      }
      else {
        local_34 = iVar2 - 0x57;
      }
    }
    else {
      local_34 = iVar2 - 0x30;
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    if (-1 < (int)local_34) {
      for (uStack_30 = 0; sVar3 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::size(boardList),
          uStack_30 < sVar3; uStack_30 = uStack_30 + 1) {
        ppAVar6 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[](boardList,uStack_30);
        bVar1 = BoardIO::GetBoardId((BoardIO *)*ppAVar6);
        if (local_34 == bVar1) {
          ppAVar6 = std::vector<AmpIO_*,_std::allocator<AmpIO_*>_>::operator[](boardList,uStack_30);
          return *ppAVar6;
        }
      }
    }
  }
  return curBoard;
}

Assistant:

AmpIO *SelectBoard(const std::string &portName, std::vector<AmpIO *> boardList, AmpIO *curBoard)
{
    AmpIO *newBoard = curBoard;
    if (boardList.size() > 1) {
        size_t i;
        std::cout << "Select " << portName << " Board: ";
        for (i = 0; i < boardList.size(); i++)
            std::cout << std::hex << static_cast<unsigned int>(boardList[i]->GetBoardId()) << " ";
        std::cout << "(any other key to keep current board " << std::hex << static_cast<unsigned int>(curBoard->GetBoardId())
                  << std::dec << ")" << std::endl;
        int num = getchar();
        if ((num >= '0') && (num <= '9')) num -= '0';
        else if ((num >= 'a') && (num <= 'f')) num = 10 + (num - 'a');
        else if ((num >= 'A') && (num <= 'F')) num = 10 + (num - 'A');
        else num = -1;
        std::cout << std::endl;
        if (num >= 0) {
            for (i = 0; i < boardList.size(); i++) {
                if (num == boardList[i]->GetBoardId()) {
                    newBoard = boardList[i];
                    break;
                }
            }
        }
    }
    return newBoard;
}